

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O1

shared_ptr<MovementSystem> __thiscall
entityx::SystemManager::system<MovementSystem>(SystemManager *this)

{
  long *plVar1;
  EntityManager *pEVar2;
  Family FVar3;
  long lVar4;
  __hash_code __code;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long in_RSI;
  long *plVar7;
  long *plVar8;
  shared_ptr<MovementSystem> sVar9;
  
  FVar3 = System<MovementSystem>::family();
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(FVar3 % *(ulong *)(in_RSI + 0x20));
  plVar7 = *(long **)(*(long *)(in_RSI + 0x18) + (long)p_Var5 * 8);
  _Var6._M_pi = p_Var5;
  plVar8 = (long *)0x0;
  if ((plVar7 != (long *)0x0) &&
     (plVar1 = (long *)*plVar7, plVar8 = plVar7, FVar3 != ((long *)*plVar7)[1])) {
    while (plVar7 = plVar1, plVar1 = (long *)*plVar7, plVar1 != (long *)0x0) {
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((ulong)plVar1[1] % *(ulong *)(in_RSI + 0x20));
      plVar8 = (long *)0x0;
      if ((_Var6._M_pi != p_Var5) || (plVar8 = plVar7, FVar3 == plVar1[1])) goto LAB_0018a9e3;
    }
    plVar8 = (long *)0x0;
  }
LAB_0018a9e3:
  if (plVar8 == (long *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = *plVar8;
  }
  if (lVar4 == 0) {
    *(undefined8 *)this = 0;
    this->entity_manager_ = (EntityManager *)0x0;
  }
  else {
    *(undefined8 *)this = *(undefined8 *)(lVar4 + 0x10);
    pEVar2 = *(EntityManager **)(lVar4 + 0x18);
    this->entity_manager_ = pEVar2;
    if (pEVar2 != (EntityManager *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pEVar2 + 8) = *(int *)(pEVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pEVar2 + 8) = *(int *)(pEVar2 + 8) + 1;
      }
    }
  }
  sVar9.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar9.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<MovementSystem>)
         sVar9.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<S> system() {
    auto it = systems_.find(S::family());
    assert(it != systems_.end());
    return it == systems_.end()
        ? std::shared_ptr<S>()
        : std::shared_ptr<S>(std::static_pointer_cast<S>(it->second));
  }